

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

float float32_unpack(uint32 x)

{
  uint in_EDI;
  double dVar1;
  double res;
  uint32 exp;
  uint32 sign;
  uint32 mantissa;
  undefined8 local_20;
  
  if ((in_EDI & 0x80000000) == 0) {
    local_20 = (double)(in_EDI & 0x1fffff);
  }
  else {
    local_20 = -(double)(in_EDI & 0x1fffff);
  }
  dVar1 = std::ldexp((double)CONCAT44((int)((ulong)local_20 >> 0x20),(float)local_20),
                     ((in_EDI & 0x7fe00000) >> 0x15) - 0x314);
  return SUB84(dVar1,0);
}

Assistant:

static float float32_unpack(uint32 x)
{
   // from the specification
   uint32 mantissa = x & 0x1fffff;
   uint32 sign = x & 0x80000000;
   uint32 exp = (x & 0x7fe00000) >> 21;
   double res = sign ? -(double)mantissa : (double)mantissa;
   return (float) ldexp((float)res, (int)exp-788);
}